

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandMfse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Acb_Par_t Pars;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Acb_ParSetDefault(&Pars);
  Extra_UtilGetoptReset();
LAB_00222c81:
  iVar1 = Extra_UtilGetopt(argc,argv,"IOWFLCadvwh");
  iVar4 = globalUtilOptind;
  switch(iVar1) {
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_00222e20:
      Abc_Print(-1,pcVar5);
      goto switchD_00222ce0_caseD_47;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nFanoutMax = iVar1;
    break;
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
    goto switchD_00222ce0_caseD_47;
  case 0x49:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
      goto LAB_00222e20;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nTfiLevMax = iVar1;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_00222e20;
    }
    Pars.nGrowthLevel = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if (Pars.nGrowthLevel + 0xc46535ffU < 0x88ca6bff) {
switchD_00222ce0_caseD_47:
      iVar4 = -2;
      Abc_Print(-2,"usage: mfse [-IOWFLC <num>] [-advwh]\n");
      Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
      Abc_Print(-2,"\t-I <num> : the number of levels in the TFI cone (2 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nTfiLevMax);
      Abc_Print(-2,"\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nTfoLevMax);
      Abc_Print(-2,"\t-W <num> : the max number of nodes in the window (1 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nWinNodeMax);
      Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
                (ulong)(uint)Pars.nFanoutMax);
      Abc_Print(-2,
                "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
                ,(ulong)(uint)Pars.nGrowthLevel);
      Abc_Print(-2,
                "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)Pars.nBTLimit);
      pcVar5 = "area";
      if (Pars.fArea == 0) {
        pcVar5 = "delay";
      }
      Abc_Print(-2,"\t-a       : toggle minimizing area [default = %s]\n",pcVar5);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (Pars.fUseAshen == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle using Ashenhurst decomposition [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar5);
      if (Pars.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar6);
      pcVar5 = "\t-h       : print the command usage\n";
LAB_00222f57:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
    goto LAB_00222c81;
  case 0x4f:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-O\" should be followed by an integer.\n";
      goto LAB_00222e20;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nTfoLevMax = iVar1;
    break;
  default:
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_00222e20;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nBTLimit = iVar1;
    }
    else {
      if (iVar1 != 0x57) {
        piVar3 = &Pars.fArea;
        if (((iVar1 != 0x61) && (piVar3 = &Pars.fUseAshen, iVar1 != 100)) &&
           (piVar3 = &Pars.fVerbose, iVar1 != 0x76)) {
          if (iVar1 != 0x77) {
            if (iVar1 == -1) {
              if (pAVar2 == (Abc_Ntk_t *)0x0) {
                pcVar5 = "Empty network.\n";
              }
              else if (pAVar2->ntkType == ABC_NTK_LOGIC) {
                Pars.nLutSize = Abc_NtkGetFaninMax(pAVar2);
                if (Pars.nLutSize < 7) {
                  Abc_NtkToSop(pAVar2,-1,1000000000);
                  pAVar2 = Abc_NtkOptMfse(pAVar2,&Pars);
                  if (pAVar2 != (Abc_Ntk_t *)0x0) {
                    Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
                    return 0;
                  }
                  pcVar5 = "Command \"mfse\" has failed.\n";
                }
                else {
                  pcVar5 = "Command is only applicable to LUT size no more than 6.\n";
                }
              }
              else {
                pcVar5 = "This command can only be applied to a logic network.\n";
              }
              iVar4 = -1;
              goto LAB_00222f57;
            }
            goto switchD_00222ce0_caseD_47;
          }
          piVar3 = &Pars.fVeryVerbose;
        }
        *(byte *)piVar3 = (byte)*piVar3 ^ 1;
        goto LAB_00222c81;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_00222e20;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWinNodeMax = iVar1;
    }
  }
  globalUtilOptind = iVar4 + 1;
  if (iVar1 < 0) goto switchD_00222ce0_caseD_47;
  goto LAB_00222c81;
}

Assistant:

int Abc_CommandMfse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkOptMfse( Abc_Ntk_t * pNtk, Acb_Par_t * pPars );
    Abc_Ntk_t * pNtkNew, * pNtk = Abc_FrameReadNtk(pAbc);
    Acb_Par_t Pars, * pPars = &Pars; int c;
    Acb_ParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOWFLCadvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfiLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfiLevMax < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinNodeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinNodeMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < -ABC_INFINITY || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'd':
            pPars->fUseAshen ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Command is only applicable to LUT size no more than 6.\n" );
        return 1;
    }
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    pNtkNew = Abc_NtkOptMfse( pNtk, pPars );
    if ( pNtkNew == NULL )
    {
        Abc_Print( -1, "Command \"mfse\" has failed.\n" );
        return 1;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: mfse [-IOWFLC <num>] [-advwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-I <num> : the number of levels in the TFI cone (2 <= num) [default = %d]\n",             pPars->nTfiLevMax );
    Abc_Print( -2, "\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-W <num> : the max number of nodes in the window (1 <= num) [default = %d]\n",            pPars->nWinNodeMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-a       : toggle minimizing area [default = %s]\n",                                      pPars->fArea? "area": "delay" );
    Abc_Print( -2, "\t-d       : toggle using Ashenhurst decomposition [default = %s]\n",                       pPars->fUseAshen? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}